

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt5a.cpp
# Opt level: O2

void __thiscall
crnlib::dxt5_endpoint_optimizer::evaluate_solution
          (dxt5_endpoint_optimizer *this,uint low_endpoint,uint high_endpoint)

{
  ulong uVar1;
  uint j;
  ulong uVar2;
  results *prVar3;
  ulong uVar4;
  uchar uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint block_type;
  uint uVar10;
  uint selector_values [8];
  
  uVar10 = 0;
  do {
    if (this->m_pParams->m_use_both_block_types + 1 <= uVar10) {
      return;
    }
    if (uVar10 == 0) {
      dxt5_block::get_block_values8(selector_values,low_endpoint,high_endpoint);
    }
    else {
      dxt5_block::get_block_values6(selector_values,low_endpoint,high_endpoint);
    }
    uVar1 = 0;
    uVar9 = 0;
    do {
      if ((this->m_unique_values).m_size <= uVar1) {
        prVar3 = this->m_pResults;
        uVar2 = prVar3->m_error;
        break;
      }
      uVar4 = 0xffffffff;
      uVar6 = 0;
      for (uVar2 = 0; uVar5 = (uchar)uVar6, uVar2 != 8; uVar2 = uVar2 + 1) {
        iVar8 = (uint)(this->m_unique_values).m_p[uVar1] - selector_values[uVar2];
        uVar7 = iVar8 * (this->m_unique_value_weights).m_p[uVar1] * iVar8;
        if (uVar7 < (uint)uVar4) {
          if (uVar7 == 0) {
            uVar4 = 0;
            uVar5 = (uchar)uVar2;
            break;
          }
          uVar6 = uVar2 & 0xffffffff;
          uVar4 = (ulong)uVar7;
        }
      }
      (this->m_trial_selectors).m_p[uVar1] = uVar5;
      uVar9 = uVar9 + uVar4;
      prVar3 = this->m_pResults;
      uVar2 = prVar3->m_error;
      uVar1 = uVar1 + 1;
    } while (uVar9 <= uVar2);
    if (uVar9 < uVar2) {
      prVar3->m_error = uVar9;
      prVar3->m_first_endpoint = (uint8)low_endpoint;
      prVar3->m_second_endpoint = (uint8)high_endpoint;
      prVar3->m_block_type = (uint8)uVar10;
      vector<unsigned_char>::swap(&this->m_best_selectors,&this->m_trial_selectors);
      if (uVar9 == 0) {
        return;
      }
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void dxt5_endpoint_optimizer::evaluate_solution(uint low_endpoint, uint high_endpoint)
    {
        for (uint block_type = 0; block_type < (m_pParams->m_use_both_block_types ? 2U : 1U); block_type++)
        {
            uint selector_values[8];

            if (!block_type)
            {
                dxt5_block::get_block_values8(selector_values, low_endpoint, high_endpoint);
            }
            else
            {
                dxt5_block::get_block_values6(selector_values, low_endpoint, high_endpoint);
            }

            uint64 trial_error = 0;

            for (uint i = 0; i < m_unique_values.size(); i++)
            {
                const uint val = m_unique_values[i];
                const uint weight = m_unique_value_weights[i];

                uint best_selector_error = UINT_MAX;
                uint best_selector = 0;

                for (uint j = 0; j < 8; j++)
                {
                    int selector_error = val - selector_values[j];
                    selector_error = selector_error * selector_error * (int)weight;

                    if (static_cast<uint>(selector_error) < best_selector_error)
                    {
                        best_selector_error = selector_error;
                        best_selector = j;
                        if (!best_selector_error)
                        {
                            break;
                        }
                    }
                }

                m_trial_selectors[i] = static_cast<uint8>(best_selector);
                trial_error += best_selector_error;

                if (trial_error > m_pResults->m_error)
                {
                    break;
                }
            }

            if (trial_error < m_pResults->m_error)
            {
                m_pResults->m_error = trial_error;
                m_pResults->m_first_endpoint = static_cast<uint8>(low_endpoint);
                m_pResults->m_second_endpoint = static_cast<uint8>(high_endpoint);
                m_pResults->m_block_type = static_cast<uint8>(block_type);
                m_best_selectors.swap(m_trial_selectors);

                if (!trial_error)
                {
                    break;
                }
            }
        }
    }